

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

int countnode234(node234_conflict *n)

{
  int iVar1;
  long lVar2;
  
  if (n == (node234_conflict *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      iVar1 = iVar1 + n->counts[lVar2];
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      iVar1 = (iVar1 + 1) - (uint)(n->elems[lVar2] == (void *)0x0);
    }
  }
  return iVar1;
}

Assistant:

static int countnode234(node234 * n)
{
    int count = 0;
    int i;
    if (!n)
        return 0;
    for (i = 0; i < 4; i++)
        count += n->counts[i];
    for (i = 0; i < 3; i++)
        if (n->elems[i])
            count++;
    return count;
}